

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O2

void __thiscall ProcessesView::ProcessesView(ProcessesView *this,QWidget *parent)

{
  QStandardItemModel *this_00;
  Worker *signal;
  int i;
  int iVar1;
  QArrayDataPointer<char16_t> local_60;
  QStringList horizontalHeader;
  Connection local_28 [8];
  
  QTreeView::QTreeView(&this->super_QTreeView,parent);
  *(undefined ***)this = &PTR_metaObject_00127da0;
  *(undefined ***)&this->field_0x10 = &PTR__ProcessesView_001280c0;
  this_00 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this_00,(QObject *)0x0);
  horizontalHeader.d.d = (Data *)0x0;
  horizontalHeader.d.ptr = (QString *)0x0;
  horizontalHeader.d.size = 0;
  QString::QString((QString *)&local_60,"Name of Process");
  QList<QString>::emplaceBack<QString>(&horizontalHeader,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QString::QString((QString *)&local_60,"Type (C/G)");
  QList<QString>::emplaceBack<QString>(&horizontalHeader,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QString::QString((QString *)&local_60,"GPU ID");
  QList<QString>::emplaceBack<QString>(&horizontalHeader,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QString::QString((QString *)&local_60,"Process ID");
  QList<QString>::emplaceBack<QString>(&horizontalHeader,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QString::QString((QString *)&local_60,"FB Mem Usage (MB)");
  QList<QString>::emplaceBack<QString>(&horizontalHeader,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QString::QString((QString *)&local_60,"SM Util (%)");
  QList<QString>::emplaceBack<QString>(&horizontalHeader,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QString::QString((QString *)&local_60,"GPU Mem Util (%)");
  QList<QString>::emplaceBack<QString>(&horizontalHeader,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QString::QString((QString *)&local_60,"Encoding (%)");
  QList<QString>::emplaceBack<QString>(&horizontalHeader,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QString::QString((QString *)&local_60,"Decoding (%)");
  QList<QString>::emplaceBack<QString>(&horizontalHeader,(QString *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QStandardItemModel::setHorizontalHeaderLabels((QList *)this_00);
  (**(code **)(*(long *)this + 0x1c8))(this,this_00);
  for (iVar1 = 0; iVar1 != 9; iVar1 = iVar1 + 1) {
    QTreeView::resizeColumnToContents((ConnectionType)this);
  }
  QAbstractItemView::setEditTriggers(this,0);
  QAbstractItemView::setAutoScroll(SUB81(this,0));
  QTreeView::setRootIsDecorated(SUB81(this,0));
  signal = InfoProvider::getWorker();
  local_60.d = (Data *)onDataUpdated;
  local_60.ptr = (char16_t *)0x0;
  QObject::connect<void(Worker::*)(),void(ProcessesView::*)()>
            ((Object *)local_28,(offset_in_Worker_to_subr)signal,(Object *)Worker::dataUpdated,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection(local_28);
  QArrayDataPointer<QString>::~QArrayDataPointer(&horizontalHeader.d);
  return;
}

Assistant:

ProcessesView::ProcessesView(QWidget *parent): QTreeView(parent) {
    auto *model = new QStandardItemModel();

    // Column titles
    QStringList horizontalHeader;
    horizontalHeader.append("Name of Process"); // Longer header increases column width so the process names are visible
    horizontalHeader.append("Type (C/G)");
    horizontalHeader.append("GPU ID");
    horizontalHeader.append("Process ID");
    horizontalHeader.append("FB Mem Usage (MB)");
    horizontalHeader.append("SM Util (%)");
    horizontalHeader.append("GPU Mem Util (%)");
    horizontalHeader.append("Encoding (%)");
    horizontalHeader.append("Decoding (%)");

    model->setHorizontalHeaderLabels(horizontalHeader);

    setModel(model);

    for (int i = 0; i < NVSMColumns::columns_count; i++)
        resizeColumnToContents(i);

    setEditTriggers(QAbstractItemView::NoEditTriggers);
    setAutoScroll(false);
    setRootIsDecorated(false);

    connect(InfoProvider::getWorker(), &InfoProvider::Worker::dataUpdated, this, &ProcessesView::onDataUpdated);
}